

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int uv_tcp_getpeername(uv_tcp_t *handle,sockaddr *name,int *namelen)

{
  int iVar1;
  
  if (handle->delayed_error != 0) {
    return handle->delayed_error;
  }
  iVar1 = uv__getsockpeername((uv_handle_t *)handle,getpeername,name,namelen);
  return iVar1;
}

Assistant:

int uv_tcp_getpeername(const uv_tcp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {

  if (handle->delayed_error)
    return handle->delayed_error;

  return uv__getsockpeername((const uv_handle_t*) handle,
                             getpeername,
                             name,
                             namelen);
}